

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathFreeObject(xmlXPathObjectPtr obj)

{
  xmlXPathObjectPtr obj_local;
  
  if (obj != (xmlXPathObjectPtr)0x0) {
    if ((obj->type == XPATH_NODESET) || (obj->type == XPATH_XSLT_TREE)) {
      if (obj->nodesetval != (xmlNodeSetPtr)0x0) {
        xmlXPathFreeNodeSet(obj->nodesetval);
      }
    }
    else if ((obj->type == XPATH_STRING) && (obj->stringval != (xmlChar *)0x0)) {
      (*xmlFree)(obj->stringval);
    }
    (*xmlFree)(obj);
  }
  return;
}

Assistant:

void
xmlXPathFreeObject(xmlXPathObjectPtr obj) {
    if (obj == NULL) return;
    if ((obj->type == XPATH_NODESET) || (obj->type == XPATH_XSLT_TREE)) {
        if (obj->nodesetval != NULL)
            xmlXPathFreeNodeSet(obj->nodesetval);
    } else if (obj->type == XPATH_STRING) {
	if (obj->stringval != NULL)
	    xmlFree(obj->stringval);
    }
    xmlFree(obj);
}